

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_copy_range(roaring_array_t *ra,uint32_t begin,uint32_t end,uint32_t new_begin)

{
  size_t __n;
  
  if (end < begin) {
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x47c9,"void ra_copy_range(roaring_array_t *, uint32_t, uint32_t, uint32_t)");
  }
  if (new_begin < begin) {
    __n = (size_t)(int)(end - begin);
    memmove(ra->containers + new_begin,ra->containers + begin,__n * 8);
    memmove(ra->keys + new_begin,ra->keys + begin,__n * 2);
    memmove(ra->typecodes + new_begin,ra->typecodes + begin,__n);
    return;
  }
  __assert_fail("new_begin < begin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x47ca,"void ra_copy_range(roaring_array_t *, uint32_t, uint32_t, uint32_t)");
}

Assistant:

void ra_copy_range(roaring_array_t *ra, uint32_t begin, uint32_t end,
                   uint32_t new_begin) {
    assert(begin <= end);
    assert(new_begin < begin);

    const int range = end - begin;

    // We ensure to previously have freed overwritten containers
    // that are not copied elsewhere

    memmove(&(ra->containers[new_begin]), &(ra->containers[begin]),
            sizeof(container_t *) * range);
    memmove(&(ra->keys[new_begin]), &(ra->keys[begin]),
            sizeof(uint16_t) * range);
    memmove(&(ra->typecodes[new_begin]), &(ra->typecodes[begin]),
            sizeof(uint8_t) * range);
}